

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O3

AttConfig * __thiscall QPDFJob::AttConfig::mimetype(AttConfig *this,string *parameter)

{
  long lVar1;
  string local_40;
  
  lVar1 = std::__cxx11::string::find((char)parameter,0x2f);
  if (lVar1 == -1) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"mime type should be specified as type/subtype","");
    usage(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::string::_M_assign((string *)&(this->att).mimetype);
  return this;
}

Assistant:

QPDFJob::AttConfig*
QPDFJob::AttConfig::mimetype(std::string const& parameter)
{
    if (parameter.find('/') == std::string::npos) {
        usage("mime type should be specified as type/subtype");
    }
    this->att.mimetype = parameter;
    return this;
}